

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

int32_t llama_relative_position_bucket
                  (llama_pos x,llama_pos y,uint64_t n_buckets,bool bidirectional)

{
  int *piVar1;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  int in_EDI;
  float fVar2;
  double dVar3;
  double dVar4;
  int32_t relative_position_if_large;
  int32_t relative_bucket;
  int32_t relative_position;
  int64_t max_exact;
  int64_t max_distance;
  int local_5c;
  float local_40;
  int local_3c;
  int local_38 [4];
  ulong local_28;
  undefined8 local_20;
  byte local_11;
  ulong local_10;
  
  local_11 = in_CL & 1;
  local_20 = 0x80;
  local_10 = in_RDX;
  if (local_11 != 0) {
    local_10 = in_RDX >> 1;
  }
  local_28 = local_10 >> 1;
  local_38[3] = in_EDI - in_ESI;
  local_38[2] = 0;
  if (local_11 == 0) {
    local_38[1] = 0;
    piVar1 = std::min<int>(local_38 + 3,local_38 + 1);
    local_38[3] = -*piVar1;
  }
  else {
    local_38[2] = (uint)(0 < local_38[3]) * (int)local_10;
    if (local_38[3] < 1) {
      local_38[3] = -local_38[3];
    }
  }
  dVar4 = (double)(long)local_28;
  fVar2 = logf((float)((double)local_38[3] / dVar4));
  local_40 = (float)(local_10 - local_28);
  dVar3 = log(128.0 / (double)(long)local_28);
  fVar2 = floorf((float)(dVar4 + (double)(fVar2 * local_40) / dVar3));
  local_38[0] = (int)fVar2;
  local_3c = (int)local_10 + -1;
  piVar1 = std::min<int>(local_38,&local_3c);
  local_5c = *piVar1;
  if ((long)local_38[3] < (long)local_28) {
    local_5c = local_38[3];
  }
  return local_5c + local_38[2];
}

Assistant:

static int32_t llama_relative_position_bucket(llama_pos x, llama_pos y, uint64_t n_buckets, bool bidirectional) {
    // TODO move to hparams if a T5 variant appears that uses a different value
    const int64_t max_distance = 128;

    if (bidirectional) {
        n_buckets >>= 1;
    }

    const int64_t max_exact = n_buckets >> 1;

    int32_t relative_position = x - y;
    int32_t relative_bucket = 0;

    if (bidirectional) {
        relative_bucket += (relative_position > 0) * n_buckets;
        relative_position = abs(relative_position);
    } else {
        relative_position = -std::min<int32_t>(relative_position, 0);
    }

    int32_t relative_position_if_large = floorf(max_exact + logf(1.0 * relative_position / max_exact) * (n_buckets - max_exact) / log(1.0 * max_distance / max_exact));
    relative_position_if_large = std::min<int32_t>(relative_position_if_large, n_buckets - 1);
    relative_bucket += (relative_position < max_exact ? relative_position : relative_position_if_large);

    return relative_bucket;
}